

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfBufferView(BufferView *bufferView,json *o)

{
  char cVar1;
  long lVar2;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  BufferView *bufferView_local;
  
  local_18 = o;
  o_local = (json *)bufferView;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"buffer",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)(o_local + 2),local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"byteLength",&local_71);
  SerializeNumberProperty<unsigned_long>(&local_70,*(unsigned_long *)(o_local + 3),local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if ((object_t *)0x3 < o_local[3].m_value.object) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"byteStride",&local_99);
    SerializeNumberProperty<unsigned_long>(&local_98,o_local[3].m_value.number_unsigned,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  if (o_local[2].m_value.object != (object_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"byteOffset",&local_c1);
    SerializeNumberProperty<unsigned_long>(&local_c0,o_local[2].m_value.number_unsigned,local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  if ((*(int *)(o_local + 4) == 0x8892) || (*(int *)(o_local + 4) == 0x8893)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,"target",&local_e9);
    SerializeNumberProperty<int>(&local_e8,*(int *)(o_local + 4),local_18);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_110,"name",&local_111);
    SerializeStringProperty(&local_110,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  cVar1 = Value::Type((Value *)&o_local[4].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"extras",&local_139);
    SerializeValue(&local_138,(Value *)&o_local[4].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  return;
}

Assistant:

static void SerializeGltfBufferView(BufferView &bufferView, json &o) {
  SerializeNumberProperty("buffer", bufferView.buffer, o);
  SerializeNumberProperty<size_t>("byteLength", bufferView.byteLength, o);

  // byteStride is optional, minimum allowed is 4
  if (bufferView.byteStride >= 4) {
    SerializeNumberProperty<size_t>("byteStride", bufferView.byteStride, o);
  }
  // byteOffset is optional, default is 0
  if (bufferView.byteOffset > 0) {
    SerializeNumberProperty<size_t>("byteOffset", bufferView.byteOffset, o);
  }
  // Target is optional, check if it contains a valid value
  if (bufferView.target == TINYGLTF_TARGET_ARRAY_BUFFER ||
      bufferView.target == TINYGLTF_TARGET_ELEMENT_ARRAY_BUFFER) {
    SerializeNumberProperty("target", bufferView.target, o);
  }
  if (bufferView.name.size()) {
    SerializeStringProperty("name", bufferView.name, o);
  }

  if (bufferView.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", bufferView.extras, o);
  }
}